

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O1

NumberType ICM::Parser::parseInteger(string *str,uint64_t *value,bool minus,Format format)

{
  int iVar1;
  long *__nptr;
  int *piVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined7 in_register_00000011;
  NumberType NVar5;
  char *__lhs;
  string s;
  allocator local_79;
  long *local_78 [2];
  long local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  
  __lhs = "";
  if ((int)CONCAT71(in_register_00000011,minus) != 0) {
    __lhs = "-";
  }
  std::operator+(&local_58,__lhs,str);
  std::__cxx11::string::string((string *)local_78,local_58._M_dataplus._M_p,&local_79);
  __nptr = local_78[0];
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  uVar3 = strtoll((char *)__nptr,(char **)&local_38,format);
  if (local_38 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stoll");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar4);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_0012e721;
    uVar3 = std::__throw_out_of_range("stoll");
  }
  *piVar2 = iVar1;
LAB_0012e721:
  *value = uVar3;
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  uVar3 = *value;
  NVar5 = nt_int8;
  if (((long)(char)uVar3 != uVar3) && (NVar5 = nt_int16, (long)(short)uVar3 != uVar3)) {
    NVar5 = ((long)(int)uVar3 != uVar3) + nt_int32;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return NVar5;
}

Assistant:

static NumberType parseInteger(const string &str, uint64_t &value, bool minus, Format format)
		{
			string s = (minus ? "-" : "") + str;
			(int64_t&)value = std::stoll(s.c_str(), 0, format);
			return getLimitTypeInt(value);
		}